

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eat.c
# Opt level: O0

int doeat(obj *otmp)

{
  boolean bVar1;
  ushort uVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  long lVar6;
  obj *otmp_00;
  uint uVar7;
  bool bVar8;
  int local_58;
  bool local_51;
  char *local_50;
  uint local_40;
  int tmp;
  int material;
  int res;
  uint uStack_1c;
  boolean dont_start;
  int nutrit;
  int basenutrit;
  obj *otmp_local;
  
  bVar8 = false;
  if (u.uprops[0x22].intrinsic != 0) {
    pline("If you can\'t breathe air, how can you consume solids?");
    return 0;
  }
  if ((otmp != (obj *)0x0) && (bVar1 = validate_object(otmp,allobj,"eat"), bVar1 == '\0')) {
    return 0;
  }
  _nutrit = otmp;
  if (otmp == (obj *)0x0) {
    _nutrit = floorfood("eat");
  }
  if (_nutrit == (obj *)0x0) {
    return 0;
  }
  bVar1 = check_capacity((char *)0x0);
  if (bVar1 != '\0') {
    return 0;
  }
  if ((((byte)u._1052_1_ >> 6 & 1) != 0) && (iVar3 = edibility_prompts(_nutrit), iVar3 != 0)) {
    body_part(0x11);
    pline("Your %s stops tingling and your sense of smell returns to normal.");
    u._1052_1_ = u._1052_1_ & 0xbf;
    if (iVar3 == 1) {
      return 0;
    }
  }
  bVar1 = is_edible(_nutrit);
  if (bVar1 == '\0') {
    pline("You cannot eat that!");
    return 0;
  }
  if ((_nutrit->owornmask & 0x19007fU) != 0) {
    pline("You can\'t eat something you\'re wearing.");
    return 0;
  }
  if ((((10 < (*(ushort *)&objects[_nutrit->otyp].field_0x11 >> 4 & 0x1f)) &&
       ((*(ushort *)&objects[_nutrit->otyp].field_0x11 >> 4 & 0x1f) < 0x12)) && (u.umonnum == 0xd9))
     && ((*(uint *)&_nutrit->field_0x4a >> 0xc & 1) != 0)) {
    *(uint *)&_nutrit->field_0x4a = *(uint *)&_nutrit->field_0x4a & 0xffffff7f | 0x80;
    if (1 < _nutrit->quan) {
      if (_nutrit->where == '\x03') {
        _nutrit = splitobj(_nutrit,1);
      }
      else {
        splitobj(_nutrit,(long)_nutrit->quan + -1);
      }
    }
    pcVar4 = xname(_nutrit);
    pline("Ulch!  That %s was rustproofed!",pcVar4);
    *(uint *)&_nutrit->field_0x4a = *(uint *)&_nutrit->field_0x4a & 0xffffefff;
    uVar7 = u.uprops[0x1b].intrinsic;
    iVar3 = rn2(10);
    make_stunned((ulong)(uVar7 + iVar3),'\x01');
    pcVar4 = xname(_nutrit);
    pcVar4 = the(pcVar4);
    pcVar5 = surface((int)u.ux,(int)u.uy);
    pline("You spit %s out onto the %s.",pcVar4,pcVar5);
    if (_nutrit->where == '\x03') {
      freeinv(_nutrit);
      dropy(_nutrit);
    }
    stackobj(_nutrit);
    return 1;
  }
  if (_nutrit->otyp == 0xb4) {
    pline("This ring is indigestible!");
    rottenfood(_nutrit);
    if ((((*(uint *)&_nutrit->field_0x4a >> 5 & 1) != 0) &&
        ((objects[_nutrit->otyp].field_0x10 & 1) == 0)) &&
       (objects[_nutrit->otyp].oc_uname == (char *)0x0)) {
      docall(_nutrit);
    }
    return 1;
  }
  if (_nutrit->oclass != '\a') {
    victual.reqtime = 1;
    victual.piece = _nutrit;
    victual.usedtime = 0;
    victual._20_1_ = victual._20_1_ & 0xfe | u.uhs == 0;
    if (_nutrit->oclass == '\f') {
      if (_nutrit->quan < 0x30d41) {
        local_40 = _nutrit->quan / 100;
      }
      else {
        local_40 = 2000;
      }
      uStack_1c = local_40;
    }
    else if ((_nutrit->oclass == '\x0f') || (_nutrit->oclass == '\x10')) {
      uStack_1c = weight(_nutrit);
    }
    else {
      uStack_1c = (uint)objects[_nutrit->otyp].oc_nutrition;
    }
    victual.nmod = uStack_1c;
    victual._20_1_ = victual._20_1_ & 0xfb | 4;
    uVar2 = *(ushort *)&objects[_nutrit->otyp].field_0x11 >> 4 & 0x1f;
    if (((uVar2 == 7) || (uVar2 == 9)) || (uVar2 == 10)) {
      violated(7);
    }
    else if (uVar2 == 2) {
      violated(6);
    }
    else {
      violated(5);
    }
    if ((*(uint *)&_nutrit->field_0x4a & 1) != 0) {
      rottenfood(_nutrit);
    }
    if ((_nutrit->oclass == '\x02') && ((*(uint *)&_nutrit->field_0x4a >> 0xf & 1) != 0)) {
      pline("Ecch - that must have been poisonous!");
      if ((((u.uprops[6].intrinsic == 0) && (u.uprops[6].extrinsic == 0)) &&
          ((youmonst.mintrinsics & 0x20) == 0)) ||
         (((((u.uprops[6].intrinsic & 0x4000000) != 0 && ((u.uprops[6].intrinsic & 0xfbffffff) == 0)
            ) && (u.uprops[6].extrinsic == 0)) && ((youmonst.mintrinsics & 0x20) == 0)))) {
        if (((u.uprops[6].intrinsic == 0) && (u.uprops[6].extrinsic == 0)) &&
           ((youmonst.mintrinsics & 0x20) == 0)) {
          iVar3 = rnd(4);
          losestr(iVar3,'\0');
        }
        bVar8 = false;
        if ((((u.uprops[6].intrinsic & 0x4000000) != 0) &&
            (bVar8 = false, (u.uprops[6].intrinsic & 0xfbffffff) == 0)) &&
           (bVar8 = false, u.uprops[6].extrinsic == 0)) {
          bVar8 = (youmonst.mintrinsics & 0x20) == 0;
        }
        iVar3 = 0xf;
        if (bVar8) {
          iVar3 = 7;
        }
        iVar3 = rnd(iVar3);
        pcVar4 = xname(_nutrit);
        losehp(iVar3,pcVar4,0);
      }
      else {
        pline("You seem unaffected by the poison.");
      }
    }
    else if ((*(uint *)&_nutrit->field_0x4a & 1) == 0) {
      if (_nutrit->oclass == '\f') {
        local_50 = foodword(_nutrit);
      }
      else {
        local_50 = singular(_nutrit,xname);
      }
      pline("This %s is delicious!",local_50);
    }
    eatspecial();
    return 1;
  }
  if (_nutrit == victual.piece) {
    local_51 = true;
    if (((youmonst.data)->mlet != '0') && (local_51 = true, ((youmonst.data)->mflags2 & 0x100) == 0)
       ) {
      local_51 = youmonst.data == mons + 0x85;
    }
    if ((uint)local_51 != (*(uint *)&_nutrit->field_0x4a >> 0x1b & 1)) {
      victual.piece = (obj *)0x0;
    }
  }
  if (((_nutrit == victual.piece) && ((*(uint *)&_nutrit->field_0x4a >> 0x1b & 1) != 0)) &&
     (lVar6 = peek_at_iced_corpse_age(_nutrit), lVar6 + victual.usedtime + 5 < (long)(ulong)moves))
  {
    victual.piece = (obj *)0x0;
  }
  if (_nutrit == victual.piece) {
    if (u.uhs != 0) {
      victual._20_1_ = victual._20_1_ & 0xfe;
    }
    victual.piece = touchfood(_nutrit);
    pline("You resume your meal.");
    start_eating(victual.piece);
    return 1;
  }
  if (_nutrit->otyp == 0x129) {
    start_tin(_nutrit);
    return 1;
  }
  otmp_00 = touchfood(_nutrit);
  victual.usedtime = 0;
  victual.piece = otmp_00;
  if (otmp_00->otyp == 0x10e) {
    iVar3 = eatcorpse(otmp_00);
    if (iVar3 == 3) {
      victual.piece = (obj *)0x0;
      if (((*(uint *)&otmp_00->field_0x4a >> 0x1b & 1) == 0) &&
         (otmp_00->oeaten == (uint)mons[otmp_00->corpsenm].cnutrit)) {
        otmp_00->oeaten = 0;
      }
      u.uconduct.food = u.uconduct.food - 1;
      return 0;
    }
    if (iVar3 == 2) {
      victual.piece = (obj *)0x0;
      return 1;
    }
    bVar8 = iVar3 != 0;
    goto LAB_001c4fc6;
  }
  if ((*(ushort *)&objects[otmp_00->otyp].field_0x11 >> 4 & 0x1f) == 4) {
    if (otmp_00->otyp == 0x10f) {
      violated(6);
    }
    else {
      violated(7);
    }
  }
  else if (((otmp_00->otyp == 0x123) || (otmp_00->otyp == 0x122)) ||
          ((otmp_00->otyp == 0x120 || ((otmp_00->otyp == 0x121 || (otmp_00->otyp == 0x11f)))))) {
    violated(6);
  }
  else {
    violated(5);
  }
  victual.reqtime = (int)objects[otmp_00->otyp].oc_delay;
  if (otmp_00->otyp == 0x122) {
LAB_001c4fbb:
    fprefx(otmp_00);
  }
  else {
    if ((*(uint *)&otmp_00->field_0x4a & 1) == 0) {
      uVar7 = 0x1e;
      if ((*(uint *)&otmp_00->field_0x4a >> 1 & 1) != 0) {
        uVar7 = 0x32;
      }
      if ((moves - otmp_00->age <= uVar7) ||
         (((*(uint *)&otmp_00->field_0x4a >> 8 & 3) == 0 && (iVar3 = rn2(7), iVar3 != 0))))
      goto LAB_001c4fbb;
    }
    iVar3 = rottenfood(otmp_00);
    bVar8 = iVar3 != 0;
    if (bVar8) {
      *(uint *)&otmp_00->field_0x4a = *(uint *)&otmp_00->field_0x4a & 0xfffffcff | 0x100;
    }
    if (otmp_00->oeaten < 2) {
      victual.piece = (obj *)0x0;
      if (otmp_00->where == '\x03') {
        useup(otmp_00);
      }
      else {
        useupf(otmp_00,1);
      }
      return 1;
    }
    consume_oeaten(otmp_00,1);
  }
LAB_001c4fc6:
  if (otmp_00->otyp == 0x10e) {
    uVar2 = mons[otmp_00->corpsenm].cnutrit;
  }
  else {
    uVar2 = objects[otmp_00->otyp].oc_nutrition;
  }
  uStack_1c = (uint)uVar2;
  res = otmp_00->oeaten;
  if ((otmp_00->otyp == 0x10e) && ((*(uint *)&otmp_00->field_0x4a >> 0x1b & 1) != 0)) {
    res = res - ((uint)mons[otmp_00->corpsenm].cnutrit << 2) / 5;
    uStack_1c = uStack_1c - ((uint)mons[otmp_00->corpsenm].cnutrit << 2) / 5;
  }
  if (uStack_1c == 0) {
    local_58 = 0;
  }
  else {
    local_58 = rounddiv((long)victual.reqtime * (long)res,uStack_1c);
  }
  victual.reqtime = local_58;
  if ((local_58 == 0) || (res == 0)) {
    victual.nmod = 0;
  }
  else if (res < local_58) {
    victual.nmod = local_58 % res;
  }
  else {
    victual.nmod = -(res / local_58);
  }
  victual._20_1_ = victual._20_1_ & 0xfe | u.uhs == 0;
  if (!bVar8) {
    start_eating(otmp_00);
  }
  return 1;
}

Assistant:

int doeat(struct obj *otmp)	/* generic "eat" command funtion (see cmd.c) */
{
	int basenutrit;			/* nutrition of full item */
	int nutrit;			/* nutrition available */
	boolean dont_start = FALSE;
	
	if (Strangled) {
		pline("If you can't breathe air, how can you consume solids?");
		return 0;
	}
	if (otmp && !validate_object(otmp, allobj, "eat"))
		return 0;
	else if (!otmp)
		otmp = floorfood("eat");
	if (!otmp) return 0;
	if (check_capacity(NULL)) return 0;

	if (u.uedibility) {
		int res = edibility_prompts(otmp);
		if (res) {
		    pline("Your %s stops tingling and your sense of smell returns to normal.",
			body_part(NOSE));
		    u.uedibility = 0;
		    if (res == 1) return 0;
		}
	}

	/* We have to make non-foods take 1 move to eat, unless we want to
	 * do ridiculous amounts of coding to deal with partly eaten plate
	 * mails, players who polymorph back to human in the middle of their
	 * metallic meal, etc....
	 */
	if (!is_edible(otmp)) {
	    pline("You cannot eat that!");
	    return 0;
	} else if ((otmp->owornmask & (W_ARMOR | W_TOOL | W_AMUL | W_SADDLE)) != 0) {
	    /* let them eat rings */
	    pline("You can't eat something you're wearing.");
	    return 0;
	}
	if (is_metallic(otmp) &&
	    u.umonnum == PM_RUST_MONSTER && otmp->oerodeproof) {
	    	otmp->rknown = TRUE;
		if (otmp->quan > 1L) {
		    if (!carried(otmp))
			splitobj(otmp, otmp->quan - 1L);
		    else
			otmp = splitobj(otmp, 1L);
		}
		pline("Ulch!  That %s was rustproofed!", xname(otmp));
		/* The regurgitated object's rustproofing is gone now */
		otmp->oerodeproof = 0;
		make_stunned(HStun + rn2(10), TRUE);
		pline("You spit %s out onto the %s.", the(xname(otmp)),
			surface(u.ux, u.uy));
		if (carried(otmp)) {
			freeinv(otmp);
			dropy(otmp);
		}
		stackobj(otmp);
		return 1;
	}
	/* KMH -- Slow digestion is... indigestible */
	if (otmp->otyp == RIN_SLOW_DIGESTION) {
		pline("This ring is indigestible!");
		rottenfood(otmp);
		if (otmp->dknown && !objects[otmp->otyp].oc_name_known
				&& !objects[otmp->otyp].oc_uname)
			docall(otmp);
		return 1;
	}
	if (otmp->oclass != FOOD_CLASS) {
	    int material;
	    victual.reqtime = 1;
	    victual.piece = otmp;
		/* Don't split it, we don't need to if it's 1 move */
	    victual.usedtime = 0;
	    victual.canchoke = (u.uhs == SATIATED);
		/* Note: gold weighs 1 pt. for each 1000 pieces (see */
		/* pickup.c) so gold and non-gold is consistent. */
	    if (otmp->oclass == COIN_CLASS)
		basenutrit = ((otmp->quan > 200000L) ? 2000
			: (int)(otmp->quan/100L));
	    else if (otmp->oclass == BALL_CLASS || otmp->oclass == CHAIN_CLASS)
		basenutrit = weight(otmp);
	    /* oc_nutrition is usually weight anyway */
	    else basenutrit = objects[otmp->otyp].oc_nutrition;
	    victual.nmod = basenutrit;
	    victual.eating = TRUE; /* needed for lesshungry() */

	    /* Eating non-food-objects breaks food-conducts here */
	    material = objects[otmp->otyp].oc_material;
	    if (material == LEATHER || material == BONE || material == DRAGON_HIDE)
		violated(CONDUCT_VEGETARIAN);
	    else if (material == WAX)
		violated(CONDUCT_VEGAN);
	    else
		violated(CONDUCT_FOODLESS);

	    if (otmp->cursed)
		rottenfood(otmp);

	    if (otmp->oclass == WEAPON_CLASS && otmp->opoisoned) {
		pline("Ecch - that must have been poisonous!");
		if (!FPoison_resistance) {
		    if (!Poison_resistance)
			losestr(rnd(4), FALSE);
		    losehp(rnd(PPoison_resistance ? 7 : 15),
			   xname(otmp), KILLED_BY_AN);
		} else {
		    pline("You seem unaffected by the poison.");
		}
	    } else if (!otmp->cursed)
		pline("This %s is delicious!",
		      otmp->oclass == COIN_CLASS ? foodword(otmp) :
		      singular(otmp, xname));

	    eatspecial();
	    return 1;
	}

	/* [ALI] Hero polymorphed in the meantime. */
	if (otmp == victual.piece && is_vampiric(youmonst.data) != otmp->odrained)
	    victual.piece = NULL;	/* can't resume */

	/* [ALI] Blood can coagulate during the interruption
	 *       but not during the draining process.
	 */
	if (otmp == victual.piece && otmp->odrained &&
	    peek_at_iced_corpse_age(otmp) + victual.usedtime + 5 < moves)
	    victual.piece = NULL;	/* can't resume */

	if (otmp == victual.piece) {
	/* If they weren't able to choke, they don't suddenly become able to
	 * choke just because they were interrupted.  On the other hand, if
	 * they were able to choke before, if they lost food it's possible
	 * they shouldn't be able to choke now.
	 */
	    if (u.uhs != SATIATED) victual.canchoke = FALSE;
	    victual.piece = touchfood(otmp);
	    pline("You resume your meal.");
	    start_eating(victual.piece);
	    return 1;
	}

	/* nothing in progress - so try to find something. */
	/* tins are a special case */
	/* tins must also check conduct separately in case they're discarded */
	if (otmp->otyp == TIN) {
	    start_tin(otmp);
	    return 1;
	}

	victual.piece = otmp = touchfood(otmp);
	victual.usedtime = 0;

	/* Now we need to calculate delay and nutritional info.
	 * The base nutrition calculated here and in eatcorpse() accounts
	 * for normal vs. rotten food.  The reqtime and nutrit values are
	 * then adjusted in accordance with the amount of food left.
	 */
	if (otmp->otyp == CORPSE) {
	    int tmp = eatcorpse(otmp);
	    if (tmp == 3) {
		/* inedible */
		victual.piece = NULL;

		/* The combination of odrained == TRUE and oeaten == cnutrit
		 * represents the case of starting to drain a corpse but not
		 * getting any further (e.g. losing consciousness due to
		 * rotten food). We must preserve this case to avoid corpses
		 * changing appearance after a failed attempt to eat.
		 */
		if (!otmp->odrained && otmp->oeaten == mons[otmp->corpsenm].cnutrit)
		    otmp->oeaten = 0;
		/* ALI, conduct: didn't eat it after all */
		u.uconduct.food--;
		return 0;
	    } else if (tmp == 2) {
		/* used up */
		victual.piece = NULL;
		return 1;
	    } else if (tmp)
		dont_start = TRUE;
	    /* if not used up, eatcorpse sets up reqtime and may modify
	     * oeaten */
	} else {
	    /* No checks for WAX, LEATHER, BONE, DRAGON_HIDE.  These are
	     * all handled in the != FOOD_CLASS case, above */
	    switch (objects[otmp->otyp].oc_material) {
	    case FLESH:
		if (otmp->otyp == EGG)
		    violated(CONDUCT_VEGAN);
		else
		    violated(CONDUCT_VEGETARIAN);
		break;

	    default:
		if (otmp->otyp == PANCAKE ||
		    otmp->otyp == FORTUNE_COOKIE || /* eggs */
		    otmp->otyp == CREAM_PIE ||
		    otmp->otyp == CANDY_BAR || /* milk */
		    otmp->otyp == LUMP_OF_ROYAL_JELLY)
		    violated(CONDUCT_VEGAN);
		else
		    violated(CONDUCT_FOODLESS);
		break;
	    }

	    victual.reqtime = objects[otmp->otyp].oc_delay;
	    if (otmp->otyp != FORTUNE_COOKIE &&
		(otmp->cursed ||
		 (((moves - otmp->age) > (otmp->blessed ? 50 : 30)) &&
		(otmp->orotten || !rn2(7))))) {

		if (rottenfood(otmp)) {
		    otmp->orotten = TRUE;
		    dont_start = TRUE;
		}
		if (otmp->oeaten < 2) {
		    victual.piece = NULL;
		    if (carried(otmp)) useup(otmp);
		    else useupf(otmp, 1L);
		    return 1;
		} else {
		    consume_oeaten(otmp, 1);	/* oeaten >>= 1 */
		}
	    } else fprefx(otmp);
	}

	/* re-calc the nutrition */
	if (otmp->otyp == CORPSE) basenutrit = mons[otmp->corpsenm].cnutrit;
	else basenutrit = objects[otmp->otyp].oc_nutrition;
	nutrit = otmp->oeaten;
	if (otmp->otyp == CORPSE && otmp->odrained) {
	    nutrit -= drainlevel(otmp);
	    basenutrit -= drainlevel(otmp);
	}

	victual.reqtime = (basenutrit == 0 ? 0 :
		rounddiv(victual.reqtime * (long)nutrit, basenutrit));

	/* calculate the modulo value (nutrit. units per round eating)
	 * note: this isn't exact - you actually lose a little nutrition
	 *	 due to this method.
	 * TODO: add in a "remainder" value to be given at the end of the
	 *	 meal.
	 */
	if (victual.reqtime == 0 || nutrit == 0)
	    /* possible if most has been eaten before */
	    victual.nmod = 0;
	else if (nutrit >= victual.reqtime)
	    victual.nmod = -(nutrit / victual.reqtime);
	else
	    victual.nmod = victual.reqtime % nutrit;
	victual.canchoke = (u.uhs == SATIATED);

	if (!dont_start) start_eating(otmp);
	return 1;
}